

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_tapfail.cpp
# Opt level: O2

void __thiscall tst_qpromise_tapfail::fulfilled_void(tst_qpromise_tapfail *this)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> QVar2;
  bool bVar3;
  char cVar4;
  int iVar5;
  PromiseDataBase<void,_void_()> *this_00;
  PromiseData<void> *this_01;
  QPromiseReject<void> *in_R8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_138;
  PromiseResolver<void> resolver_1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_128;
  _Any_data local_120;
  undefined **local_110;
  PromiseData<void> *local_108;
  PromiseResolver<void> resolver;
  QPromiseBase<void> local_f0;
  QPromise<void> p_1;
  int value;
  QPromiseBase<void> local_c8;
  QPromise<void> p;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> local_a0;
  function<void_()> local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *pcStack_40;
  QPromiseBase<void> local_30;
  
  value = -1;
  QtPromise::QPromise<void>::resolve();
  p_1.super_QPromiseBase<void>.m_d.d = (PromiseData<void> *)local_30.m_d;
  if (local_30.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_30.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  p_1.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00121a98;
  local_f0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00121ae0;
  this_00 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  (this_00->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_00->m_catchers).d.size = 0;
  (this_00->m_handlers).d.size = 0;
  (this_00->m_catchers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.d = (Data *)0x0;
  (this_00->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&this_00->m_lock = 0;
  *(undefined8 *)&this_00->m_settled = 0;
  ((PromiseDataBase<void,_void_()> *)&this_00->_vptr_PromiseDataBase)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&this_00->super_QSharedData = 0;
  (this_00->m_error).m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData((PromiseData<void> *)this_00);
  LOCK();
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i =
       (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_00 != (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
         _q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_98.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00121a98;
  local_f0.m_d.d = (PromiseData<void> *)this_00;
  local_98.super__Function_base._M_functor._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_98);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_98);
  QVar2 = p_1.super_QPromiseBase<void>.m_d;
  if (resolver.m_d.d == (Data *)0x0) {
    resolver.m_d.d =
         (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
  }
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  if (resolver.m_d.d == (Data *)0x0) {
    local_138.d = (Data *)0x0;
  }
  else {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_138 = resolver.m_d.d;
  }
  local_128.d = (Data *)0x0;
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_138.d != (Data *)0x0) {
    LOCK();
    ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48 = (code *)0x0;
  pcStack_40 = (code *)0x0;
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_120._M_unused._0_8_ = resolver.m_d.d;
  local_120._8_8_ = local_138.d;
  local_c8._vptr_QPromiseBase = (_func_int **)resolver.m_d.d;
  local_58._M_unused._M_object = operator_new(0x18);
  *(void **)local_58._M_unused._0_8_ = local_120._M_unused._M_object;
  if ((Data *)local_120._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_120._M_unused._0_8_ = *local_120._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = local_120._8_8_;
  if ((Data *)local_120._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_120._8_8_ = *(int *)local_120._8_8_ + 1;
    UNLOCK();
  }
  pcStack_40 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
             ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<void>::tapFail<tst_qpromise_tapfail::fulfilled_void()::$_0>(tst_qpromise_tapfail::fulfilled_void()::$_0)const::{lambda()#1}()#1},void>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromiseBase<void>::tapFail<tst_qpromise_tapfail::fulfilled_void()::$_0>(tst_qpromise_tapfail::fulfilled_void()::$_0)const::{lambda()#1}()#1}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_120._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,(function<void_()> *)&local_58);
  std::_Function_base::~_Function_base((_Function_base *)&local_58);
  QVar2 = p_1.super_QPromiseBase<void>.m_d;
  local_120._M_unused._M_object = local_c8._vptr_QPromiseBase;
  if ((Data *)local_c8._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_c8._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)local_c8._vptr_QPromiseBase)->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_120._8_8_ = local_138.d;
  if (local_138.d != (Data *)0x0) {
    LOCK();
    ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_110 = (undefined **)&value;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = operator_new(0x18);
  *(void **)local_78._M_unused._0_8_ = local_120._M_unused._M_object;
  if ((Data *)local_120._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_120._M_unused._0_8_ = *local_120._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = local_120._8_8_;
  if ((Data *)local_120._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_120._8_8_ = *(int *)local_120._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_78._M_unused._0_8_ + 0x10) = local_110;
  pcStack_60 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
             ::_M_manager;
  QtPromisePrivate::PromiseCatcher<void,tst_qpromise_tapfail::fulfilled_void()::$_0,void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(tst_qpromise_tapfail::fulfilled_void()::$_0_const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda(QtPromisePrivate::PromiseError_const&)#1}::~function
            ((_lambda_QtPromisePrivate__PromiseError_const___1_ *)local_120._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_138);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data> *)
             &local_c8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver.m_d);
  local_f0._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00121a98;
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  local_c8.m_d = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
                 (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_>)
                 p_1.super_QPromiseBase<void>.m_d.d;
  if (p_1.super_QPromiseBase<void>.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((p_1.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_c8._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00121a98;
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00121ae0;
  this_01 = (PromiseData<void> *)operator_new(0x58);
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.size = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.size = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_catchers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.d = (Data *)0x0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_()>_> *)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).m_lock = 0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).m_settled = 0;
  (this_01->super_PromiseDataBase<void,_void_()>)._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData = 0;
  (this_01->super_PromiseDataBase<void,_void_()>).m_error.m_data._M_exception_object = (void *)0x0;
  QtPromisePrivate::PromiseData<void>::PromiseData(this_01);
  LOCK();
  pQVar1 = &(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  if (this_01 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(this_01->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       &PTR__QPromiseBase_00121a98;
  p.super_QPromiseBase<void>.m_d.d = this_01;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver_1,(QPromise<void> *)&resolver);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&resolver);
  QVar2.d = local_f0.m_d.d;
  if (resolver_1.m_d.d == (Data *)0x0) {
    local_138.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    local_138 = resolver_1.m_d.d;
  }
  local_128.d = (Data *)0x0;
  if (local_138.d == (Data *)0x0) {
    local_120._8_8_ = (Data *)0x0;
  }
  else {
    LOCK();
    ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_120._8_8_ = local_138.d;
  }
  local_a8.d = (Data *)0x0;
  if (local_138.d != (Data *)0x0) {
    LOCK();
    ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_138.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if ((Data *)local_120._8_8_ != (Data *)0x0) {
    LOCK();
    (((Data *)local_120._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((Data *)local_120._8_8_)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_108 = local_c8.m_d.d;
  if (local_c8.m_d.d != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &((local_c8.m_d.d)->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_110 = &PTR__QPromiseBase_00121a98;
  local_98.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_98.super__Function_base._M_functor._8_8_ = 0;
  local_98.super__Function_base._M_manager = (_Manager_type)0x0;
  local_98._M_invoker = (_Invoker_type)0x0;
  local_120._M_unused._0_8_ = (undefined8)local_138.d;
  local_a0.d = (Data *)local_120._8_8_;
  local_98.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(void **)local_98.super__Function_base._M_functor._M_unused._0_8_ = local_120._M_unused._M_object
  ;
  if ((Data *)local_120._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_120._M_unused._0_8_ = *local_120._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       local_120._8_8_;
  if ((Data *)local_120._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_120._8_8_ = *(int *)local_120._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00121ae0;
  *(PromiseData<void> **)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       local_108;
  if (local_108 != (PromiseData<void> *)0x0) {
    LOCK();
    pQVar1 = &(local_108->super_PromiseDataBase<void,_void_()>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00121a98;
  local_98._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_invoke;
  local_98.super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
       ::_M_manager;
  QtPromisePrivate::
  PromiseHandler<void,QtPromise::QPromiseBase<void>::tapFail<tst_qpromise_tapfail::fulfilled_void()::$_0>(tst_qpromise_tapfail::fulfilled_void()::$_0)const::{lambda()#1}()#2},void>
  ::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>(QtPromise::QPromiseBase<void>::tapFail<tst_qpromise_tapfail::fulfilled_void()::$_0>(tst_qpromise_tapfail::fulfilled_void()::$_0)const::{lambda()#1}()#2}const&,QtPromise::QPromiseResolve<void>const&,QtPromise::QPromiseReject<void>const&)
  ::{lambda()#1}::~function((_lambda___1_ *)local_120._M_pod_data);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,&local_98);
  std::_Function_base::~_Function_base(&local_98.super__Function_base);
  QVar2.d = local_f0.m_d.d;
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<void>,QtPromise::QPromiseReject<void>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_120,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_138,
             (QPromiseResolve<void> *)&local_a0,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (&(QVar2.d)->super_PromiseDataBase<void,_void_()>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_120);
  std::_Function_base::~_Function_base((_Function_base *)&local_120);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_a0);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_a8);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_138);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&local_128);
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>::
  ~QExplicitlySharedDataPointer(&resolver_1.m_d);
  p.super_QPromiseBase<void>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00121a98;
  bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                    (&(local_f0.m_d.d)->super_PromiseDataBase<void,_void_()>);
  if (!bVar3) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              (&(local_f0.m_d.d)->super_PromiseDataBase<void,_void_()>);
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_c8);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_f0);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p_1.super_QPromiseBase<void>);
  QtPromise::QPromiseBase<void>::~QPromiseBase(&local_30);
  resolver.m_d.d._0_4_ = 0xffffffff;
  p_1.super_QPromiseBase<void>._vptr_QPromiseBase =
       (_func_int **)CONCAT44(p_1.super_QPromiseBase<void>._vptr_QPromiseBase._4_4_,0x2a);
  iVar5 = waitForValue<int>(&p,(int *)&resolver,(int *)&p_1);
  cVar4 = QTest::qCompare(iVar5,0x2a,"waitForValue(p, -1, 42)","42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
                          ,0x32);
  if (cVar4 != '\0') {
    bVar3 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isFulfilled
                      (&(p.super_QPromiseBase<void>.m_d.d)->super_PromiseDataBase<void,_void_()>);
    resolver.m_d.d._0_1_ = bVar3;
    p_1.super_QPromiseBase<void>._vptr_QPromiseBase =
         (_func_int **)CONCAT71(p_1.super_QPromiseBase<void>._vptr_QPromiseBase._1_7_,1);
    bVar3 = QTest::qCompare<bool,bool>
                      ((bool *)&resolver,(bool *)&p_1,"p.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
                       ,0x33);
    if (bVar3) {
      QTest::qCompare(value,-1,"value","-1",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/qpromise/tst_tapfail.cpp"
                      ,0x34);
    }
  }
  QtPromise::QPromiseBase<void>::~QPromiseBase(&p.super_QPromiseBase<void>);
  return;
}

Assistant:

void tst_qpromise_tapfail::fulfilled_void()
{
    int value = -1;
    auto p = QtPromise::QPromise<void>::resolve().tapFail([&]() {
        value = 43;
    });

    QCOMPARE(waitForValue(p, -1, 42), 42);
    QCOMPARE(p.isFulfilled(), true);
    QCOMPARE(value, -1);
}